

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O3

uint __thiscall llvm::yaml::Input::beginSequence(Input *this)

{
  HNode *hnode;
  _func_int **pp_Var1;
  uint uVar2;
  Twine local_38;
  
  hnode = this->CurrentNode;
  if (hnode == (HNode *)0x0) {
    __assert_fail("Val && \"isa<> used on a null pointer\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Casting.h"
                  ,0x69,
                  "static bool llvm::isa_impl_cl<llvm::yaml::Input::SequenceHNode, const llvm::yaml::Input::HNode *>::doit(const From *) [To = llvm::yaml::Input::SequenceHNode, From = const llvm::yaml::Input::HNode *]"
                 );
  }
  uVar2 = hnode->_node->TypeID;
  if (uVar2 != 0) {
    if (uVar2 == 5) {
      uVar2 = (uint)((ulong)((long)hnode[1]._node - (long)hnode[1]._vptr_HNode) >> 3);
    }
    else {
      if (0xfffffffd < uVar2 - 3) {
        pp_Var1 = hnode[1]._vptr_HNode;
        if (hnode[1]._node == (Node *)0x1) {
          if (*(char *)pp_Var1 == '~') {
            return 0;
          }
        }
        else if (hnode[1]._node == (Node *)0x4) {
          if (*(int *)pp_Var1 == 0x6c6c756e) {
            return 0;
          }
          if (*(int *)pp_Var1 == 0x6c6c754e) {
            return 0;
          }
          if (*(int *)pp_Var1 == 0x4c4c554e) {
            return 0;
          }
        }
      }
      Twine::Twine(&local_38,"not a sequence");
      setError(this,hnode,&local_38);
      uVar2 = 0;
    }
  }
  return uVar2;
}

Assistant:

unsigned Input::beginSequence() {
  if (SequenceHNode *SQ = dyn_cast<SequenceHNode>(CurrentNode))
    return SQ->Entries.size();
  if (isa<EmptyHNode>(CurrentNode))
    return 0;
  // Treat case where there's a scalar "null" value as an empty sequence.
  if (ScalarHNode *SN = dyn_cast<ScalarHNode>(CurrentNode)) {
    if (isNull(SN->value()))
      return 0;
  }
  // Any other type of HNode is an error.
  setError(CurrentNode, "not a sequence");
  return 0;
}